

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

ARMMMUIdx arm_v7m_mmu_idx_all_arm(CPUARMState *env,_Bool secstate,_Bool priv,_Bool negpri)

{
  undefined4 local_18;
  ARMMMUIdx mmu_idx;
  _Bool negpri_local;
  _Bool priv_local;
  _Bool secstate_local;
  CPUARMState *env_local;
  
  local_18 = ARMMMUIdx_MUser;
  if (priv) {
    local_18 = ARMMMUIdx_MPriv;
  }
  if (negpri) {
    local_18 = local_18 | 2;
  }
  if (secstate) {
    local_18 = local_18 | 4;
  }
  return local_18;
}

Assistant:

ARMMMUIdx arm_v7m_mmu_idx_all(CPUARMState *env,
                              bool secstate, bool priv, bool negpri)
{
    ARMMMUIdx mmu_idx = ARM_MMU_IDX_M;

    if (priv) {
        mmu_idx |= ARM_MMU_IDX_M_PRIV;
    }

    if (negpri) {
        mmu_idx |= ARM_MMU_IDX_M_NEGPRI;
    }

    if (secstate) {
        mmu_idx |= ARM_MMU_IDX_M_S;
    }

    return mmu_idx;
}